

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRecDump3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Gia_Man_t *p;
  char *pcVar4;
  int c;
  int fBinary;
  int fAscii;
  Gia_Man_t *pGia;
  int nArgcNew;
  char **pArgvNew;
  char *FileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  bVar2 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"abh"), iVar3 != -1) {
    if (iVar3 == 0x61) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if (iVar3 != 0x62) {
        Abc_Print(-2,"usage: rec_dump3 [-abh] <file>\n");
        Abc_Print(-2,"\t-h     : print the command usage\n");
        pcVar4 = "no";
        if (bVar1) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-a     : toggles dumping TTs into an ASCII file [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (bVar2) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-b     : toggles dumping TTs into a binary file [default = %s]\n",pcVar4);
        Abc_Print(-2,"\t<file> : AIGER file to write the library\n");
        return 1;
      }
      bVar2 = (bool)(bVar2 ^ 1);
    }
  }
  iVar3 = Abc_NtkRecIsRunning3();
  if (iVar3 == 0) {
    Abc_Print(-1,"The AIG subgraph recording is not started.\n");
    pAbc_local._4_4_ = 1;
  }
  else if (argc - globalUtilOptind == 1) {
    pcVar4 = argv[globalUtilOptind];
    if (bVar1) {
      Abc_NtkRecDumpTt3(pcVar4,0);
    }
    else if (bVar2) {
      Abc_NtkRecDumpTt3(pcVar4,1);
    }
    else {
      p = Abc_NtkRecGetGia3();
      if (p == (Gia_Man_t *)0x0) {
        Abc_Print(0,"Library AIG is not available.\n");
        return 1;
      }
      iVar3 = Gia_ManPoNum(p);
      if (iVar3 == 0) {
        Abc_Print(0,"No structure in the library.\n");
        return 1;
      }
      Gia_AigerWrite(p,pcVar4,0,0,0);
    }
    pAbc_local._4_4_ = 0;
  }
  else {
    Abc_Print(-1,"File name is not given on the command line.\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandRecDump3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkRecDumpTt3( char * pFileName, int fBinary );
    char * FileName;
    char ** pArgvNew;
    int nArgcNew;
    Gia_Man_t * pGia;
    int fAscii = 0;
    int fBinary = 0;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "abh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAscii ^= 1;
            break;
        case 'b':
            fBinary ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_NtkRecIsRunning3() )
    {
        Abc_Print( -1, "The AIG subgraph recording is not started.\n" );
        return 1;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    // get the input file name
    FileName = pArgvNew[0];
    if ( fAscii )
        Abc_NtkRecDumpTt3( FileName, 0 );
    else if ( fBinary )
        Abc_NtkRecDumpTt3( FileName, 1 );
    else
    {
        pGia = Abc_NtkRecGetGia3();
        if( pGia == NULL )
        {
            Abc_Print( 0, "Library AIG is not available.\n" );
            return 1;
        }
        if( Gia_ManPoNum(pGia) == 0 )
        {
            Abc_Print( 0, "No structure in the library.\n" );
            return 1;
        }
        Gia_AigerWrite( pGia, FileName, 0, 0, 0 );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: rec_dump3 [-abh] <file>\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t-a     : toggles dumping TTs into an ASCII file [default = %s]\n", fAscii? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggles dumping TTs into a binary file [default = %s]\n", fBinary? "yes": "no" );
    Abc_Print( -2, "\t<file> : AIGER file to write the library\n");
    return 1;
}